

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeFormat(ParsedPatternInfo *this,UErrorCode *status)

{
  int32_t *piVar1;
  ParsedSubpatternInfo *pPVar2;
  UChar32 UVar3;
  uint uVar4;
  
  consumeIntegerFormat(this,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar3 = ParserState::peek(&this->state);
    if (UVar3 == 0x2e) {
      uVar4 = ParserState::peek(&this->state);
      (this->state).offset = ((this->state).offset - (uint)(uVar4 < 0x10000)) + 2;
      pPVar2 = this->currentSubpattern;
      pPVar2->hasDecimal = true;
      piVar1 = &pPVar2->widthExceptAffixes;
      *piVar1 = *piVar1 + 1;
      consumeFractionFormat(this,status);
      return;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeFormat(UErrorCode& status) {
    consumeIntegerFormat(status);
    if (U_FAILURE(status)) { return; }
    if (state.peek() == u'.') {
        state.next(); // consume the decimal point
        currentSubpattern->hasDecimal = true;
        currentSubpattern->widthExceptAffixes += 1;
        consumeFractionFormat(status);
        if (U_FAILURE(status)) { return; }
    }
}